

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

Dch_Cla_t * Dch_ClassesStart(Aig_Man_t *pAig)

{
  Vec_Ptr_t *pVVar1;
  Dch_Cla_t *pDVar2;
  Aig_Obj_t ***pppAVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  size_t __nmemb;
  
  pDVar2 = (Dch_Cla_t *)malloc(0x68);
  pDVar2->pAig = (Aig_Man_t *)0x0;
  pDVar2->pId2Class = (Aig_Obj_t ***)0x0;
  pDVar2->pClassSizes = (int *)0x0;
  pDVar2->nClasses = 0;
  pDVar2->nCands1 = 0;
  *(undefined8 *)&pDVar2->nLits = 0;
  pDVar2->pMemClasses = (Aig_Obj_t **)0x0;
  pDVar2->pMemClassesFree = (Aig_Obj_t **)0x0;
  pDVar2->vClassOld = (Vec_Ptr_t *)0x0;
  pDVar2->vClassNew = (Vec_Ptr_t *)0x0;
  pDVar2->pManData = (void *)0x0;
  pDVar2->pFuncNodeHash = (_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0;
  pDVar2->pFuncNodeIsConst = (_func_int_void_ptr_Aig_Obj_t_ptr *)0x0;
  pDVar2->pFuncNodesAreEqual = (_func_int_void_ptr_Aig_Obj_t_ptr_Aig_Obj_t_ptr *)0x0;
  pDVar2->pAig = pAig;
  pVVar1 = pAig->vObjs;
  __nmemb = (size_t)pVVar1->nSize;
  pppAVar3 = (Aig_Obj_t ***)calloc(__nmemb,8);
  pDVar2->pId2Class = pppAVar3;
  piVar4 = (int *)calloc(__nmemb,4);
  pDVar2->pClassSizes = piVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pDVar2->vClassOld = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pDVar2->vClassNew = pVVar5;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,pVVar1->nSize);
    return pDVar2;
  }
  __assert_fail("pAig->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                ,0x93,"Dch_Cla_t *Dch_ClassesStart(Aig_Man_t *)");
}

Assistant:

Dch_Cla_t * Dch_ClassesStart( Aig_Man_t * pAig )
{
    Dch_Cla_t * p;
    p = ABC_ALLOC( Dch_Cla_t, 1 );
    memset( p, 0, sizeof(Dch_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    assert( pAig->pReprs == NULL );
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}